

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiViewportP * FindHoveredViewportFromPlatformWindowStack(ImVec2 mouse_platform_pos)

{
  float fVar1;
  float fVar2;
  ImGuiViewportP *pIVar3;
  ImGuiViewportP *pIVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)(GImGui->Viewports).Size;
  if (0 < lVar5) {
    lVar6 = 0;
    pIVar4 = (ImGuiViewportP *)0x0;
    do {
      pIVar3 = (GImGui->Viewports).Data[lVar6];
      if ((((((pIVar3->super_ImGuiViewport).Flags & 0x90) == 0) &&
           (fVar1 = (pIVar3->super_ImGuiViewport).Pos.x, fVar1 <= mouse_platform_pos.x)) &&
          (fVar2 = (pIVar3->super_ImGuiViewport).Pos.y, fVar2 <= mouse_platform_pos.y)) &&
         (((mouse_platform_pos.x < fVar1 + (pIVar3->super_ImGuiViewport).Size.x &&
           (mouse_platform_pos.y < fVar2 + (pIVar3->super_ImGuiViewport).Size.y)) &&
          ((pIVar4 == (ImGuiViewportP *)0x0 ||
           (pIVar4->LastFrontMostStampCount < pIVar3->LastFrontMostStampCount)))))) {
        pIVar4 = pIVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
    return pIVar4;
  }
  return (ImGuiViewportP *)0x0;
}

Assistant:

static ImGuiViewportP* FindHoveredViewportFromPlatformWindowStack(const ImVec2 mouse_platform_pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* best_candidate = NULL;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        if (!(viewport->Flags & (ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_Minimized)) && viewport->GetRect().Contains(mouse_platform_pos))
            if (best_candidate == NULL || best_candidate->LastFrontMostStampCount < viewport->LastFrontMostStampCount)
                best_candidate = viewport;
    }
    return best_candidate;
}